

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

void * Wlc_NtkToNdr(Wlc_Ntk_t *pNtk)

{
  byte bVar1;
  byte *pbVar2;
  Wlc_Obj_t *pWVar3;
  int iVar4;
  int *pDesign;
  undefined1 *puVar5;
  undefined8 *puVar6;
  Vec_Int_t *p;
  int *piVar7;
  long lVar8;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar9;
  ulong uVar10;
  int iVar11;
  int Fill;
  uint uVar12;
  char *pOutputs;
  long lVar13;
  int *in_stack_ffffffffffffff98;
  char *pFunction;
  int local_3c;
  int *local_38;
  
  pDesign = (int *)malloc(0x18);
  pDesign[0] = 0;
  pDesign[1] = 0x10;
  puVar5 = (undefined1 *)malloc(0x10);
  *(undefined1 **)(pDesign + 2) = puVar5;
  puVar6 = (undefined8 *)malloc(0x100);
  *(undefined8 **)(pDesign + 4) = puVar6;
  *puVar5 = 1;
  *pDesign = 1;
  *(undefined4 *)puVar6 = 0;
  puVar5[1] = 7;
  *pDesign = 2;
  *puVar6 = 0x100000002;
  *(undefined1 *)(*(long *)(pDesign + 2) + 2) = 2;
  iVar11 = *pDesign;
  *pDesign = iVar11 + 1;
  *(undefined4 *)(*(long *)(pDesign + 4) + (long)iVar11 * 4) = 0;
  *(undefined1 *)(*(long *)(pDesign + 2) + (long)*pDesign) = 7;
  piVar7 = *(int **)(pDesign + 4);
  iVar11 = *pDesign;
  *pDesign = iVar11 + 1;
  piVar7[iVar11] = 1;
  pbVar2 = *(byte **)(pDesign + 2);
  bVar1 = pbVar2[2];
  if (bVar1 != 0) {
    if (bVar1 < 4) {
      piVar7[2] = piVar7[2] + *pDesign + -2;
      bVar1 = *pbVar2;
      if (bVar1 == 0) goto LAB_003626a0;
      if (bVar1 < 4) {
        iVar11 = *pDesign + -2 + *piVar7;
        *piVar7 = iVar11;
        if (iVar11 != *pDesign) {
          __assert_fail("(int)p->pBody[0] == p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x21c,"int Ndr_AddModule(void *, int)");
        }
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 0x10;
        p->nSize = 0;
        pFunction = (char *)0x36225f;
        piVar7 = (int *)malloc(0x40);
        p->pArray = piVar7;
        if (0 < (pNtk->vPis).nSize) {
          lVar13 = 0;
          do {
            iVar11 = (pNtk->vPis).pArray[lVar13];
            lVar8 = (long)iVar11;
            iVar4 = local_3c;
            if ((lVar8 < 1) || (pNtk->nObjsAlloc <= iVar11)) goto LAB_00362600;
            pWVar3 = pNtk->pObjs;
            in_stack_ffffffffffffff98 = (int *)0x0;
            local_3c = iVar11;
            Ndr_AddObject(pDesign,0x102,3,pWVar3[lVar8].End,pWVar3[lVar8].Beg,
                          *(uint *)(pWVar3 + lVar8) >> 6 & 1,0,0,(int *)0x1,(int)&local_3c,
                          (int *)0x0,pFunction);
            lVar13 = lVar13 + 1;
          } while (lVar13 < (pNtk->vPis).nSize);
        }
        local_3c = 1;
        if (1 < pNtk->iObj) {
          lVar13 = 1;
          local_38 = pDesign;
          do {
            iVar4 = local_3c;
            if (pNtk->nObjsAlloc <= lVar13) goto LAB_00362600;
            if ((undefined1  [24])((undefined1  [24])pNtk->pObjs[lVar13] & (undefined1  [24])0x3e)
                != (undefined1  [24])0x0) {
              pWVar3 = pNtk->pObjs + lVar13;
              p->nSize = 0;
              uVar10 = (ulong)pWVar3->nFanins;
              if (0 < (int)pWVar3->nFanins) {
                lVar8 = 0;
                do {
                  if ((2 < (uint)uVar10) ||
                     (paVar9 = &pWVar3->field_10,
                     (undefined1  [24])((undefined1  [24])*pWVar3 & (undefined1  [24])0x2f) ==
                     (undefined1  [24])0x6)) {
                    paVar9 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)
                             (pWVar3->field_10).pFanins[0];
                  }
                  pFunction = (char *)0x362370;
                  Vec_IntPush(p,paVar9->Fanins[lVar8]);
                  lVar8 = lVar8 + 1;
                  uVar10 = (ulong)(int)pWVar3->nFanins;
                } while (lVar8 < (long)uVar10);
              }
              if ((undefined1  [24])((undefined1  [24])*pWVar3 & (undefined1  [24])0x3f) ==
                  (undefined1  [24])0x6) {
                iVar4 = pWVar3->End - pWVar3->Beg;
                iVar11 = -iVar4;
                if (0 < iVar4) {
                  iVar11 = iVar4;
                }
                pFunction = (char *)0x3623a1;
                Ndr_ObjWriteConstant((uint *)(pWVar3->field_10).pFanins[0],iVar11 + 1);
                pOutputs = Ndr_ObjWriteConstant::Buffer;
              }
              else {
                pOutputs = (char *)0x0;
              }
              pDesign = local_38;
              uVar12 = *(ushort *)pWVar3 & 0x3f;
              iVar4 = local_3c;
              if (uVar12 == 3) {
                uVar12 = ((pWVar3->field_10).Fanins[1] + (pNtk->vPos).nSize) - (pNtk->vPis).nSize;
                if (((int)uVar12 < 0) || ((pNtk->vCos).nSize <= (int)uVar12)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar11 = (pNtk->vCos).pArray[uVar12];
                if ((iVar11 < 1) || (pNtk->nObjsAlloc <= iVar11)) goto LAB_00362600;
                if (p->nSize != 0) {
                  __assert_fail("Vec_IntSize(vFanins) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                                ,0xde,"void *Wlc_NtkToNdr(Wlc_Ntk_t *)");
                }
                Vec_IntPush(p,iVar11);
                pFunction = (char *)0x362471;
                Vec_IntFillExtra(p,7,Fill);
                iVar11 = 0x59;
              }
              else {
                if (uVar12 == 8) {
                  paVar9 = &pWVar3->field_10;
                  if (((*(ushort *)pWVar3 & 0x2f) == 6) || (2 < pWVar3->nFanins)) {
                    paVar9 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar9->pFanins[0];
                  }
                  lVar8 = (long)paVar9->Fanins[0];
                  if ((lVar8 < 1) || (pNtk->nObjsAlloc <= paVar9->Fanins[0])) goto LAB_00362600;
                  iVar11 = 0x2b;
                  if (pNtk->pObjs[lVar8].End != pNtk->pObjs[lVar8].Beg) goto LAB_0036247f;
                }
                pFunction = (char *)0x36247d;
                iVar11 = Ndr_TypeWlc2Ndr(uVar12);
              }
LAB_0036247f:
              if (iVar11 < 1) {
                __assert_fail("Type > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                              ,0xe5,"void *Wlc_NtkToNdr(Wlc_Ntk_t *)");
              }
              in_stack_ffffffffffffff98 = (int *)0x0;
              Ndr_AddObject(pDesign,0x102,iVar11,pWVar3->End,pWVar3->Beg,*(uint *)pWVar3 >> 6 & 1,
                            p->nSize,(int)p->pArray,(int *)0x1,(int)&local_3c,(int *)pOutputs,
                            pFunction);
            }
            lVar13 = lVar13 + 1;
            local_3c = (int)lVar13;
          } while (lVar13 < pNtk->iObj);
        }
        lVar13 = 1;
        if (1 < pNtk->iObj) {
          lVar13 = 1;
          lVar8 = 0x18;
          do {
            iVar4 = (int)lVar13;
            if (pNtk->nObjsAlloc <= lVar13) {
LAB_00362600:
              local_3c = iVar4;
              __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                            ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
            }
            pWVar3 = pNtk->pObjs;
            if (((&pWVar3->field_0x1)[lVar8] & 2) != 0) {
              if (p->nCap < 1) {
                if (p->pArray == (int *)0x0) {
                  pFunction = (char *)0x362543;
                  piVar7 = (int *)malloc(4);
                }
                else {
                  pFunction = (char *)0x362537;
                  piVar7 = (int *)realloc(p->pArray,4);
                }
                p->pArray = piVar7;
                if (piVar7 == (int *)0x0) {
                  local_3c = iVar4;
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                p->nCap = 1;
              }
              piVar7 = p->pArray;
              *piVar7 = iVar4;
              p->nSize = 1;
              in_stack_ffffffffffffff98 =
                   (int *)((ulong)in_stack_ffffffffffffff98 & 0xffffffff00000000);
              Ndr_AddObject(pDesign,0x102,4,*(int *)((long)&pWVar3->End + lVar8),
                            *(int *)((long)&pWVar3->Beg + lVar8),
                            *(uint *)(&pWVar3->field_0x0 + lVar8) >> 6 & 1,1,(int)piVar7,
                            in_stack_ffffffffffffff98,0,(int *)0x0,pFunction);
            }
            lVar13 = lVar13 + 1;
            lVar8 = lVar8 + 0x18;
          } while (lVar13 < pNtk->iObj);
        }
        local_3c = (int)lVar13;
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
        return pDesign;
      }
    }
    __assert_fail("Ndr_DataType(p, i) <= NDR_OBJECT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                  ,0x83,"void Ndr_DataAddTo(Ndr_Data_t *, int, int)");
  }
LAB_003626a0:
  __assert_fail("p->pHead[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
}

Assistant:

void * Wlc_NtkToNdr( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, iOutId, Type;
    // create a new module
    void * pDesign = Ndr_Create( 1 );
    int ModId = Ndr_AddModule( pDesign, 1 );
    // add primary inputs
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    Wlc_NtkForEachPi( pNtk, pObj, i ) 
    {
        iOutId = Wlc_ObjId(pNtk, pObj);
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CI, 0,   
            pObj->End, pObj->Beg, pObj->Signed,   
            0, NULL,      1, &iOutId,  NULL  ); // no fanins
    }
    // add internal nodes 
    Wlc_NtkForEachObj( pNtk, pObj, iOutId ) 
    {
        char * pFunction = NULL;
        if ( Wlc_ObjIsPi(pObj) || pObj->Type == 0 )
            continue;
        Vec_IntClear( vFanins );
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Vec_IntPush( vFanins, iFanin );
        if ( pObj->Type == WLC_OBJ_CONST )
            pFunction = Ndr_ObjWriteConstant( (unsigned *)Wlc_ObjFanins(pObj), Wlc_ObjRange(pObj) );
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjRange(Wlc_ObjFanin0(pNtk, pObj)) > 1 )
            Type = ABC_OPER_SEL_NMUX;
        else if ( pObj->Type == WLC_OBJ_FO )
        {
            Wlc_Obj_t * pFi = Wlc_ObjFo2Fi( pNtk, pObj );
            assert( Vec_IntSize(vFanins) == 0 );
            Vec_IntPush( vFanins, Wlc_ObjId(pNtk, pFi) );
            Vec_IntFillExtra( vFanins, 7, 0 );
            Type = ABC_OPER_DFFRSE;
        }
        else
            Type = Ndr_TypeWlc2Ndr(pObj->Type);
        assert( Type > 0 );
        Ndr_AddObject( pDesign, ModId, Type, 0,   
            pObj->End, pObj->Beg, pObj->Signed,   
            Vec_IntSize(vFanins), Vec_IntArray(vFanins), 1, &iOutId,  pFunction  ); 
    }
    // add primary outputs
    Wlc_NtkForEachObj( pNtk, pObj, iOutId ) 
    {
        if ( !Wlc_ObjIsPo(pObj) )
            continue;
        Vec_IntFill( vFanins, 1, iOutId );
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CO, 0,                   
            pObj->End, pObj->Beg, pObj->Signed,   
            1, Vec_IntArray(vFanins),  0, NULL,  NULL ); 
    }
    Vec_IntFree( vFanins );
    return pDesign;
}